

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen-x86_64.c
# Opt level: O0

uint8_t * target_translate(gen_ctx_t gen_ctx,size_t *len)

{
  MIR_insn_t insn_00;
  size_t *gen_ctx_00;
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  uint8_t *puVar5;
  size_t insn_len;
  size_t len_before;
  size_t sStack_40;
  int padn;
  size_t n;
  size_t curr_size;
  int max_insn_size;
  int ind;
  MIR_insn_t insn;
  MIR_context_t ctx;
  size_t *len_local;
  gen_ctx_t gen_ctx_local;
  
  insn = (MIR_insn_t)gen_ctx->ctx;
  ctx = (MIR_context_t)len;
  len_local = (size_t *)gen_ctx;
  if (gen_ctx->curr_func_item->item_type != MIR_func_item) {
    __assert_fail("gen_ctx->curr_func_item->item_type == MIR_func_item",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                  ,0xb44,"uint8_t *target_translate(gen_ctx_t, size_t *)");
  }
  translate_init(gen_ctx);
  n = 0;
  VARR_inttrunc(*(VARR_int **)(len_local[0x27] + 0x20),0);
  for (_max_insn_size =
            DLIST_MIR_insn_t_head((DLIST_MIR_insn_t *)(*(long *)(len_local[2] + 0x40) + 0x18));
      _max_insn_size != (MIR_insn_t)0x0; _max_insn_size = DLIST_MIR_insn_t_next(_max_insn_size)) {
    if ((int)*(undefined8 *)&_max_insn_size->field_0x18 == 0xb4) {
      iVar1 = gen_nested_loop_label_p((gen_ctx_t)len_local,_max_insn_size);
      if (iVar1 != 0) {
        n = n + 8;
      }
      set_label_disp((gen_ctx_t)len_local,_max_insn_size,n);
    }
    else if ((int)*(undefined8 *)&_max_insn_size->field_0x18 != 0xb9) {
      curr_size._4_4_ = find_insn_pattern((gen_ctx_t)len_local,_max_insn_size,(int *)&curr_size);
      if (curr_size._4_4_ < 0) {
        fprintf(_stderr,"Fatal failure in matching insn:");
        MIR_output_insn((MIR_context_t)insn,(FILE *)_stderr,_max_insn_size,
                        *(MIR_func_t *)(len_local[2] + 0x40),1);
        exit(1);
      }
      n = (long)(int)curr_size + n;
      if ((int)*(undefined8 *)&_max_insn_size->field_0x18 == 0xaa) {
        n = (uint)(((int)((ulong)*(undefined8 *)&_max_insn_size->field_0x18 >> 0x20) + -1) * 8) + n;
      }
      VARR_intpush(*(VARR_int **)(len_local[0x27] + 0x20),curr_size._4_4_);
    }
  }
  sStack_40 = 0;
  _max_insn_size =
       DLIST_MIR_insn_t_head((DLIST_MIR_insn_t *)(*(long *)(len_local[2] + 0x40) + 0x18));
  do {
    if (_max_insn_size == (MIR_insn_t)0x0) {
      puVar5 = translate_finish((gen_ctx_t)len_local,(size_t *)ctx);
      return puVar5;
    }
    if ((int)*(undefined8 *)&_max_insn_size->field_0x18 == 0xb4) {
      iVar1 = gen_nested_loop_label_p((gen_ctx_t)len_local,_max_insn_size);
      if (iVar1 != 0) {
        sVar2 = VARR_uint8_tlength(*(VARR_uint8_t **)(len_local[0x27] + 0x30));
        len_before._4_4_ = 8 - ((uint)sVar2 & 7);
        if (len_before._4_4_ == 8) {
          len_before._4_4_ = 0;
        }
        if (7 < len_before._4_4_) {
          __assert_fail("(size_t) padn < sizeof (nop_pats) / sizeof (char *)",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                        ,0xb5f,"uint8_t *target_translate(gen_ctx_t, size_t *)");
        }
        if (len_before._4_4_ != 0) {
          VARR_uint8_tpush_arr
                    (*(VARR_uint8_t **)(len_local[0x27] + 0x30),
                     (uint8_t *)nop_pats[(int)len_before._4_4_],(long)(int)len_before._4_4_);
        }
      }
      gen_ctx_00 = len_local;
      insn_00 = _max_insn_size;
      sVar2 = VARR_uint8_tlength(*(VARR_uint8_t **)(len_local[0x27] + 0x30));
      set_label_disp((gen_ctx_t)gen_ctx_00,insn_00,sVar2);
    }
    else if ((int)*(undefined8 *)&_max_insn_size->field_0x18 != 0xb9) {
      sVar2 = sStack_40 + 1;
      curr_size._4_4_ = VARR_intget(*(VARR_int **)(len_local[0x27] + 0x20),sStack_40);
      iVar1 = MIR_branch_code_p((MIR_insn_code_t)*(undefined8 *)&_max_insn_size->field_0x18);
      if (iVar1 != 0) {
        curr_size._4_4_ = find_insn_pattern((gen_ctx_t)len_local,_max_insn_size,(int *)0x0);
      }
      if (curr_size._4_4_ < 0) {
        __assert_fail("ind >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                      ,0xb67,"uint8_t *target_translate(gen_ctx_t, size_t *)");
      }
      sVar3 = VARR_uint8_tlength(*(VARR_uint8_t **)(len_local[0x27] + 0x30));
      out_insn((gen_ctx_t)len_local,_max_insn_size,patterns[curr_size._4_4_].replacement,
               (void **)0x0);
      sVar4 = VARR_uint8_tlength(*(VARR_uint8_t **)(len_local[0x27] + 0x30));
      sStack_40 = sVar2;
      if (((ulong)(long)patterns[curr_size._4_4_].max_insn_size < sVar4 - sVar3) &&
         ((int)*(undefined8 *)&_max_insn_size->field_0x18 != 0xaa)) {
        fprintf(_stderr,"\"%s\" max size(%d) < real size(%d)\n",
                patterns[curr_size._4_4_].replacement,
                (ulong)(uint)patterns[curr_size._4_4_].max_insn_size,sVar4 - sVar3 & 0xffffffff);
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                      ,0xb71,"uint8_t *target_translate(gen_ctx_t, size_t *)");
      }
    }
    _max_insn_size = DLIST_MIR_insn_t_next(_max_insn_size);
  } while( true );
}

Assistant:

static uint8_t *target_translate (gen_ctx_t gen_ctx, size_t *len) {
  MIR_context_t ctx = gen_ctx->ctx;
  MIR_insn_t insn;
  int ind, max_insn_size;
  size_t curr_size, n;

  gen_assert (curr_func_item->item_type == MIR_func_item);
  translate_init (gen_ctx);
  curr_size = 0;
  VARR_TRUNC (int, insn_pattern_indexes, 0);
  for (insn = DLIST_HEAD (MIR_insn_t, curr_func_item->u.func->insns); insn != NULL;
       insn = DLIST_NEXT (MIR_insn_t, insn)) {
    if (insn->code == MIR_LABEL) {
      if (gen_nested_loop_label_p (gen_ctx, insn)) curr_size += LOOP_ALIGN;
      set_label_disp (gen_ctx, insn, curr_size); /* estimation */
    } else if (insn->code != MIR_USE) {
      ind = find_insn_pattern (gen_ctx, insn, &max_insn_size);
      if (ind < 0) {
        fprintf (stderr, "Fatal failure in matching insn:");
        MIR_output_insn (ctx, stderr, insn, curr_func_item->u.func, TRUE);
        exit (1);
      }
      curr_size += max_insn_size;
      if (insn->code == MIR_SWITCH) curr_size += (insn->nops - 1) * 8; /* label addresses */
      VARR_PUSH (int, insn_pattern_indexes, ind);
    }
  }
  for (n = 0, insn = DLIST_HEAD (MIR_insn_t, curr_func_item->u.func->insns); insn != NULL;
       insn = DLIST_NEXT (MIR_insn_t, insn)) {
    if (insn->code == MIR_LABEL) {
      if (gen_nested_loop_label_p (gen_ctx, insn)) {
        int padn = LOOP_ALIGN - (int) (VARR_LENGTH (uint8_t, result_code) % LOOP_ALIGN);
        if (padn == LOOP_ALIGN) padn = 0;
        gen_assert ((size_t) padn < sizeof (nop_pats) / sizeof (char *));
        if (padn != 0) VARR_PUSH_ARR (uint8_t, result_code, (uint8_t *) nop_pats[padn], padn);
      }
      set_label_disp (gen_ctx, insn, VARR_LENGTH (uint8_t, result_code));
    } else if (insn->code != MIR_USE) {
      ind = VARR_GET (int, insn_pattern_indexes, n++);
      if (MIR_branch_code_p (insn->code)) /* possible replacement change */
        ind = find_insn_pattern (gen_ctx, insn, NULL);
      gen_assert (ind >= 0);
#ifndef NDEBUG
      size_t len_before = VARR_LENGTH (uint8_t, result_code);
#endif
      out_insn (gen_ctx, insn, patterns[ind].replacement, NULL);
#ifndef NDEBUG
      size_t insn_len = VARR_LENGTH (uint8_t, result_code) - len_before;
      if (insn_len > (size_t) patterns[ind].max_insn_size && insn->code != MIR_SWITCH) {
        fprintf (stderr, "\"%s\" max size(%d) < real size(%d)\n", patterns[ind].replacement,
                 patterns[ind].max_insn_size, (int) insn_len);
        gen_assert (FALSE);
      }
#endif
    }
  }
  return translate_finish (gen_ctx, len);
}